

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int mriStep_Init(void *arkode_mem,int init_type)

{
  long *liw;
  long *lrw;
  int iVar1;
  int *piVar2;
  realtype *prVar3;
  N_Vector *pp_Var4;
  long lVar5;
  char *msgfmt;
  size_t sVar6;
  MRIStepCoupling MRIC;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  
  iVar1 = mriStep_AccessStepMem(arkode_mem,"mriStep_Init",&ark_mem,&step_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (init_type != 0) {
    if (init_type == 1) {
      return 0;
    }
LAB_003bd040:
    if ((step_mem->linit == (ARKLinsolInitFn)0x0) ||
       (iVar1 = (*step_mem->linit)(ark_mem), iVar1 == 0)) {
      if ((step_mem->NLS == (SUNNonlinearSolver)0x0) ||
         (iVar1 = mriStep_NlsInit(ark_mem), iVar1 == 0)) {
        ark_mem->call_fullrhs = 1;
        return 0;
      }
      msgfmt = "Unable to initialize SUNNonlinearSolver object";
      iVar1 = -0x1d;
    }
    else {
      msgfmt = "The linear solver\'s init routine failed.";
      iVar1 = -5;
    }
    goto LAB_003bd1b1;
  }
  if (step_mem->implicit_rhs == 0 && ark_mem->user_efun == 0) {
    ark_mem->user_efun = 0;
    ark_mem->efun = arkEwtSetSmallReal;
    ark_mem->e_data = ark_mem;
  }
  if (ark_mem->fixedstep == 0) {
    msgfmt = "Adaptive outer time stepping is not currently supported";
  }
  else {
    iVar1 = mriStep_SetCoupling(ark_mem);
    if (iVar1 == 0) {
      iVar1 = mriStep_CheckCoupling(ark_mem);
      if (iVar1 == 0) {
        MRIC = step_mem->MRIC;
        piVar2 = step_mem->stage_map;
        sVar6 = (size_t)MRIC->stages;
        step_mem->stages = MRIC->stages;
        iVar1 = MRIC->p;
        step_mem->q = MRIC->q;
        step_mem->p = iVar1;
        if (piVar2 == (int *)0x0) {
          lVar5 = ark_mem->liw;
        }
        else {
          free(piVar2);
          sVar6 = (size_t)step_mem->stages;
          lVar5 = ark_mem->liw - sVar6;
          MRIC = step_mem->MRIC;
        }
        piVar2 = (int *)calloc(sVar6,4);
        step_mem->stage_map = piVar2;
        ark_mem->liw = lVar5 + sVar6;
        iVar1 = mriStepCoupling_GetStageMap(MRIC,piVar2,&step_mem->nstages_stored);
        if (iVar1 == 0) {
          liw = &ark_mem->liw;
          if (step_mem->stagetypes == (int *)0x0) {
            iVar1 = step_mem->stages;
            lVar5 = *liw;
            sVar6 = (size_t)iVar1;
          }
          else {
            free(step_mem->stagetypes);
            iVar1 = step_mem->stages;
            sVar6 = (size_t)iVar1;
            lVar5 = *liw - sVar6;
          }
          piVar2 = (int *)calloc(sVar6,4);
          step_mem->stagetypes = piVar2;
          *liw = lVar5 + sVar6;
          for (lVar5 = 0; sVar6 = (size_t)iVar1, lVar5 < (long)sVar6; lVar5 = lVar5 + 1) {
            iVar1 = mriStepCoupling_GetStageType(step_mem->MRIC,(int)lVar5);
            step_mem->stagetypes[lVar5] = iVar1;
            iVar1 = step_mem->stages;
          }
          if (step_mem->Ae_row == (realtype *)0x0) {
            lVar5 = ark_mem->lrw;
          }
          else {
            free(step_mem->Ae_row);
            sVar6 = (size_t)step_mem->stages;
            lVar5 = ark_mem->lrw - sVar6;
          }
          prVar3 = (realtype *)calloc(sVar6,8);
          step_mem->Ae_row = prVar3;
          lrw = &ark_mem->lrw;
          lVar5 = lVar5 + sVar6;
          ark_mem->lrw = lVar5;
          if (step_mem->Ai_row != (realtype *)0x0) {
            free(step_mem->Ai_row);
            sVar6 = (size_t)step_mem->stages;
            lVar5 = *lrw - sVar6;
          }
          prVar3 = (realtype *)calloc(sVar6,8);
          step_mem->Ai_row = prVar3;
          *lrw = lVar5 + sVar6;
          if ((step_mem->explicit_rhs != 0) &&
             (iVar1 = arkAllocVecArray(step_mem->nstages_stored,ark_mem->ewt,&step_mem->Fse,
                                       ark_mem->lrw1,lrw,ark_mem->liw1,liw), iVar1 == 0)) {
            return -0x14;
          }
          if (step_mem->implicit_rhs == 0) {
LAB_003bd391:
            if ((step_mem->NLS != (SUNNonlinearSolver)0x0) && (step_mem->ownNLS != 0)) {
              SUNNonlinSolFree(step_mem->NLS);
              step_mem->NLS = (SUNNonlinearSolver)0x0;
              step_mem->ownNLS = 0;
            }
            step_mem->lsolve = (ARKLinsolSolveFn)0x0;
            step_mem->lfree = (ARKLinsolFreeFn)0x0;
            step_mem->linit = (ARKLinsolInitFn)0x0;
            step_mem->lsetup = (ARKLinsolSetupFn)0x0;
            step_mem->lmem = (void *)0x0;
          }
          else {
            iVar1 = arkAllocVecArray(step_mem->nstages_stored,ark_mem->ewt,&step_mem->Fsi,
                                     ark_mem->lrw1,lrw,ark_mem->liw1,liw);
            if (iVar1 == 0) {
              return -0x14;
            }
            if (step_mem->implicit_rhs == 0) goto LAB_003bd391;
            iVar1 = arkAllocVec(ark_mem,ark_mem->ewt,&step_mem->sdata);
            if (iVar1 == 0) {
              return -0x14;
            }
            iVar1 = arkAllocVec(ark_mem,ark_mem->ewt,&step_mem->zpred);
            if (iVar1 == 0) {
              return -0x14;
            }
            iVar1 = arkAllocVec(ark_mem,ark_mem->ewt,&step_mem->zcor);
            if (iVar1 == 0) {
              return -0x14;
            }
          }
          sVar6 = (long)step_mem->stages * 2 + 2;
          iVar1 = (int)sVar6;
          step_mem->nfusedopvecs = iVar1;
          if (step_mem->cvals == (realtype *)0x0) {
            prVar3 = (realtype *)calloc(sVar6,8);
            step_mem->cvals = prVar3;
            if (prVar3 == (realtype *)0x0) {
              return -0x14;
            }
            *lrw = *lrw + sVar6;
          }
          if (step_mem->Xvecs == (N_Vector *)0x0) {
            pp_Var4 = (N_Vector *)calloc((long)iVar1,8);
            step_mem->Xvecs = pp_Var4;
            if (pp_Var4 == (N_Vector *)0x0) {
              return -0x14;
            }
            *liw = *liw + (long)iVar1;
          }
          iVar1 = mriStepInnerStepper_AllocVecs(step_mem->stepper,step_mem->MRIC->nmat,ark_mem->ewt)
          ;
          if (iVar1 != 0) {
            arkProcessError(ark_mem,-0x16,"ARKode::MRIStep","mriStep_Init",
                            "Error allocating inner stepper memory");
            return -0x14;
          }
          if ((ark_mem->interp == (ARKInterp)0x0) ||
             (iVar1 = arkInterpSetDegree(ark_mem,ark_mem->interp,1 - step_mem->q), iVar1 == 0))
          goto LAB_003bd040;
          msgfmt = "Unable to update interpolation polynomial degree";
          goto LAB_003bd1af;
        }
      }
      msgfmt = "Error in coupling table";
    }
    else {
      msgfmt = "Could not create coupling table";
    }
  }
LAB_003bd1af:
  iVar1 = -0x16;
LAB_003bd1b1:
  arkProcessError(ark_mem,iVar1,"ARKode::MRIStep","mriStep_Init",msgfmt);
  return iVar1;
}

Assistant:

int mriStep_Init(void* arkode_mem, int init_type)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval, j;
  booleantype reset_efun;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_Init",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* immediately return if reset */
  if (init_type == RESET_INIT) return(ARK_SUCCESS);

  /* initializations/checks for (re-)initialization call */
  if (init_type == FIRST_INIT) {

    /* enforce use of arkEwtSmallReal if using a fixed step size for
       an explicit method and an internal error weight function */
    reset_efun = SUNTRUE;
    if ( step_mem->implicit_rhs )  reset_efun = SUNFALSE;
    if ( ark_mem->user_efun )  reset_efun = SUNFALSE;
    if (reset_efun) {
      ark_mem->user_efun = SUNFALSE;
      ark_mem->efun      = arkEwtSetSmallReal;
      ark_mem->e_data    = ark_mem;
    }

    /* assume fixed outer step size */
    if (!ark_mem->fixedstep) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep", "mriStep_Init",
                      "Adaptive outer time stepping is not currently supported");
      return(ARK_ILL_INPUT);
    }

    /* Create coupling structure (if not already set) */
    retval = mriStep_SetCoupling(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep", "mriStep_Init",
                      "Could not create coupling table");
      return(ARK_ILL_INPUT);
    }

    /* Check that coupling structure is OK */
    retval = mriStep_CheckCoupling(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                      "mriStep_Init", "Error in coupling table");
      return(ARK_ILL_INPUT);
    }

    /* Retrieve/store method and embedding orders now that tables are finalized */
    step_mem->stages = step_mem->MRIC->stages;
    step_mem->q = step_mem->MRIC->q;
    step_mem->p = step_mem->MRIC->p;

    /* allocate/fill derived quantities from MRIC structure */

    /* stage map */
    if (step_mem->stage_map) {
      free(step_mem->stage_map);
      step_mem->stage_map = NULL;
      ark_mem->liw -= step_mem->stages;
    }
    step_mem->stage_map = (int *) calloc(step_mem->stages, sizeof(int));
    ark_mem->liw += step_mem->stages;

    retval = mriStepCoupling_GetStageMap(step_mem->MRIC,
                                         step_mem->stage_map,
                                         &(step_mem->nstages_stored));
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                      "mriStep_Init", "Error in coupling table");
      return(ARK_ILL_INPUT);
    }

    /* stage types */
    if (step_mem->stagetypes) {
      free(step_mem->stagetypes);
      step_mem->stagetypes = NULL;
      ark_mem->liw -= step_mem->stages;
    }
    step_mem->stagetypes = (int *) calloc(step_mem->stages, sizeof(int));
    ark_mem->liw += step_mem->stages;
    for (j=0; j<step_mem->stages; j++)
      step_mem->stagetypes[j] = mriStepCoupling_GetStageType(step_mem->MRIC, j);

    /* explicit RK coefficient row */
    if (step_mem->Ae_row) {
      free(step_mem->Ae_row);
      step_mem->Ae_row = NULL;
      ark_mem->lrw -= step_mem->stages;
    }
    step_mem->Ae_row = (realtype *) calloc(step_mem->stages,
                                           sizeof(realtype));
    ark_mem->lrw += step_mem->stages;

    /* implicit RK coefficient row */
    if (step_mem->Ai_row) {
      free(step_mem->Ai_row);
      step_mem->Ai_row = NULL;
      ark_mem->lrw -= step_mem->stages;
    }
    step_mem->Ai_row = (realtype *) calloc(step_mem->stages,
                                           sizeof(realtype));
    ark_mem->lrw += step_mem->stages;

    /* Allocate MRI RHS vector memory, update storage requirements */
    /*   Allocate Fse[0] ... Fse[nstages_stored - 1] if needed */
    if (step_mem->explicit_rhs) {
      if (!arkAllocVecArray(step_mem->nstages_stored,
                            ark_mem->ewt, &(step_mem->Fse),
                            ark_mem->lrw1, &(ark_mem->lrw),
                            ark_mem->liw1, &(ark_mem->liw)))
        return(ARK_MEM_FAIL);
    }

    /*   Allocate Fsi[0] ... Fsi[nstages_stored - 1] if needed */
    if (step_mem->implicit_rhs) {
      if (!arkAllocVecArray(step_mem->nstages_stored,
                            ark_mem->ewt, &(step_mem->Fsi),
                            ark_mem->lrw1, &(ark_mem->lrw),
                            ark_mem->liw1, &(ark_mem->liw)))
        return(ARK_MEM_FAIL);
    }

    /* if any slow stage is implicit, allocate sdata, zpred, zcor vectors;
       if all stages explicit, free default NLS object, and detach all
       linear solver routines.  Note: step_mem->implicit_rhs will only equal
       SUNTRUE if an implicit table has been user-provided. */
    if (step_mem->implicit_rhs) {
      if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->sdata)))
        return(ARK_MEM_FAIL);
      if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->zpred)))
        return(ARK_MEM_FAIL);
      if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->zcor)))
        return(ARK_MEM_FAIL);
    } else {
      if ((step_mem->NLS != NULL) && (step_mem->ownNLS)) {
        SUNNonlinSolFree(step_mem->NLS);
        step_mem->NLS = NULL;
        step_mem->ownNLS = SUNFALSE;
      }
      step_mem->linit  = NULL;
      step_mem->lsetup = NULL;
      step_mem->lsolve = NULL;
      step_mem->lfree  = NULL;
      step_mem->lmem   = NULL;
    }

    /* Allocate reusable arrays for fused vector interface */
    step_mem->nfusedopvecs = 2*step_mem->stages + 2;
    if (step_mem->cvals == NULL) {
      step_mem->cvals = (realtype *) calloc(step_mem->nfusedopvecs, sizeof(realtype));
      if (step_mem->cvals == NULL)  return(ARK_MEM_FAIL);
      ark_mem->lrw += (step_mem->nfusedopvecs);
    }
    if (step_mem->Xvecs == NULL) {
      step_mem->Xvecs = (N_Vector *) calloc(step_mem->nfusedopvecs, sizeof(N_Vector));
      if (step_mem->Xvecs == NULL)  return(ARK_MEM_FAIL);
      ark_mem->liw += (step_mem->nfusedopvecs);   /* pointers */
    }

    /* Allocate inner stepper data */
    retval = mriStepInnerStepper_AllocVecs(step_mem->stepper,
                                           step_mem->MRIC->nmat, ark_mem->ewt);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep", "mriStep_Init",
                      "Error allocating inner stepper memory");
      return(ARK_MEM_FAIL);
    }

    /* Limit interpolant degree based on method order (use negative
       argument to specify update instead of overwrite) */
    if (ark_mem->interp != NULL) {
      retval = arkInterpSetDegree(ark_mem, ark_mem->interp, -(step_mem->q-1));
      if (retval != ARK_SUCCESS) {
        arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep", "mriStep_Init",
                        "Unable to update interpolation polynomial degree");
        return(ARK_ILL_INPUT);
      }
    }

  }

  /* Call linit (if it exists) */
  if (step_mem->linit) {
    retval = step_mem->linit(ark_mem);
    if (retval != 0) {
      arkProcessError(ark_mem, ARK_LINIT_FAIL, "ARKode::MRIStep", "mriStep_Init",
                      MSG_ARK_LINIT_FAIL);
      return(ARK_LINIT_FAIL);
    }
  }

  /* Initialize the nonlinear solver object (if it exists) */
  if (step_mem->NLS) {
    retval = mriStep_NlsInit(ark_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_NLS_INIT_FAIL, "ARKode::MRIStep", "mriStep_Init",
                      "Unable to initialize SUNNonlinearSolver object");
      return(ARK_NLS_INIT_FAIL);
    }
  }

  /* Signal to shared arkode module that fullrhs is required after each step */
  ark_mem->call_fullrhs = SUNTRUE;

  return(ARK_SUCCESS);
}